

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O1

void __thiscall FString::StripLeftRight(FString *this)

{
  char *__src;
  int iVar1;
  FStringData *pFVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  __src = this->Chars;
  uVar6 = (ulong)*(uint *)(__src + -0xc);
  if (uVar6 != 0) {
    uVar4 = 0;
    do {
      iVar1 = isspace((uint)(byte)__src[uVar4]);
      uVar5 = uVar4;
      if (iVar1 == 0) break;
      uVar4 = uVar4 + 1;
      uVar5 = uVar6;
    } while (uVar6 != uVar4);
    uVar4 = uVar6 - 1;
    while ((uVar5 <= uVar4 && (iVar1 = isspace((uint)(byte)__src[uVar4]), iVar1 != 0))) {
      uVar4 = uVar4 - 1;
    }
    if (uVar6 - 1 != uVar4 || uVar5 != 0) {
      if (1 < *(int *)(__src + -4)) {
        sVar3 = (uVar4 - uVar5) + 1;
        pFVar2 = FStringData::Alloc(sVar3);
        this->Chars = (char *)(pFVar2 + 1);
        pFVar2->Len = (uint)sVar3;
        memcpy(pFVar2 + 1,__src,sVar3);
        *(undefined1 *)((long)pFVar2 + (uVar4 - uVar5) + 0xd) = 0;
        FStringData::Release((FStringData *)(__src + -0xc));
        return;
      }
      sVar3 = 0;
      for (; uVar5 <= uVar4; uVar5 = uVar5 + 1) {
        this->Chars[sVar3] = this->Chars[uVar5];
        sVar3 = sVar3 + 1;
      }
      this->Chars[sVar3] = '\0';
      ReallocBuffer(this,sVar3);
      return;
    }
  }
  return;
}

Assistant:

FString &FString::operator += (const FString &tail)
{
	size_t len1 = Len();
	size_t len2 = tail.Len();
	ReallocBuffer (len1 + len2);
	StrCopy (Chars + len1, tail);
	return *this;
}